

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall t_swift_generator::generate_service(t_swift_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  
  poVar1 = &this->f_decl_;
  generate_swift_service_protocol(this,(ostream *)poVar1,tservice);
  generate_swift_service_client(this,(ostream *)poVar1,tservice);
  if (this->async_clients_ == true) {
    generate_swift_service_protocol_async(this,(ostream *)poVar1,tservice);
    generate_swift_service_client_async(this,(ostream *)poVar1,tservice);
  }
  generate_swift_service_server(this,(ostream *)poVar1,tservice);
  generate_swift_service_helpers(this,tservice);
  poVar1 = &this->f_impl_;
  generate_swift_service_client_implementation(this,(ostream *)poVar1,tservice);
  if (this->async_clients_ == true) {
    generate_swift_service_client_async_implementation(this,(ostream *)poVar1,tservice);
  }
  generate_swift_service_server_implementation(this,(ostream *)poVar1,tservice);
  return;
}

Assistant:

void t_swift_generator::generate_service(t_service* tservice) {

  generate_swift_service_protocol(f_decl_, tservice);
  generate_swift_service_client(f_decl_, tservice);
  if (async_clients_) {
    generate_swift_service_protocol_async(f_decl_, tservice);
    generate_swift_service_client_async(f_decl_, tservice);
  }
  generate_swift_service_server(f_decl_, tservice);

  generate_swift_service_helpers(tservice);

  generate_swift_service_client_implementation(f_impl_, tservice);
  if (async_clients_) {
    generate_swift_service_client_async_implementation(f_impl_, tservice);
  }
  generate_swift_service_server_implementation(f_impl_, tservice);
}